

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter_Postprocess.cpp
# Opt level: O0

void __thiscall
Assimp::AMFImporter::Postprocess_BuildNodeAndObject
          (AMFImporter *this,CAMFImporter_NodeElement_Object *pNodeElement,
          list<aiMesh_*,_std::allocator<aiMesh_*>_> *pMeshList,aiNode **pSceneNode)

{
  CAMFImporter_NodeElement_Color *pNodeElement_00;
  bool bVar1;
  aiNode *this_00;
  list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_> *this_01;
  reference ppCVar2;
  undefined1 local_90 [8];
  vector<CAMFImporter_NodeElement_Color_*,_std::allocator<CAMFImporter_NodeElement_Color_*>_>
  color_arr;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> vertex_arr;
  CAMFImporter_NodeElement *ne_child;
  const_iterator __end1;
  const_iterator __begin1;
  list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_> *__range1;
  CAMFImporter_NodeElement_Color *local_30;
  CAMFImporter_NodeElement_Color *object_color;
  aiNode **pSceneNode_local;
  list<aiMesh_*,_std::allocator<aiMesh_*>_> *pMeshList_local;
  CAMFImporter_NodeElement_Object *pNodeElement_local;
  AMFImporter *this_local;
  
  local_30 = (CAMFImporter_NodeElement_Color *)0x0;
  this_00 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(this_00);
  *pSceneNode = this_00;
  aiString::operator=(&(*pSceneNode)->mName,&(pNodeElement->super_CAMFImporter_NodeElement).ID);
  this_01 = &(pNodeElement->super_CAMFImporter_NodeElement).Child;
  __end1 = std::__cxx11::
           list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>::begin
                     (this_01);
  ne_child = (CAMFImporter_NodeElement *)
             std::__cxx11::
             list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>::end
                       (this_01);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&ne_child);
    if (!bVar1) break;
    ppCVar2 = std::_List_const_iterator<CAMFImporter_NodeElement_*>::operator*(&__end1);
    pNodeElement_00 = (CAMFImporter_NodeElement_Color *)*ppCVar2;
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector
              ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
               &color_arr.
                super__Vector_base<CAMFImporter_NodeElement_Color_*,_std::allocator<CAMFImporter_NodeElement_Color_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<CAMFImporter_NodeElement_Color_*,_std::allocator<CAMFImporter_NodeElement_Color_*>_>
    ::vector((vector<CAMFImporter_NodeElement_Color_*,_std::allocator<CAMFImporter_NodeElement_Color_*>_>
              *)local_90);
    if ((pNodeElement_00->super_CAMFImporter_NodeElement).Type == ENET_Color) {
      local_30 = pNodeElement_00;
    }
    if ((pNodeElement_00->super_CAMFImporter_NodeElement).Type == ENET_Mesh) {
      PostprocessHelper_CreateMeshDataArray
                (this,(CAMFImporter_NodeElement_Mesh *)pNodeElement_00,
                 (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                 &color_arr.
                  super__Vector_base<CAMFImporter_NodeElement_Color_*,_std::allocator<CAMFImporter_NodeElement_Color_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<CAMFImporter_NodeElement_Color_*,_std::allocator<CAMFImporter_NodeElement_Color_*>_>
                  *)local_90);
      Postprocess_BuildMeshSet
                (this,(CAMFImporter_NodeElement_Mesh *)pNodeElement_00,
                 (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                 &color_arr.
                  super__Vector_base<CAMFImporter_NodeElement_Color_*,_std::allocator<CAMFImporter_NodeElement_Color_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<CAMFImporter_NodeElement_Color_*,_std::allocator<CAMFImporter_NodeElement_Color_*>_>
                  *)local_90,local_30,pMeshList,*pSceneNode);
    }
    std::vector<CAMFImporter_NodeElement_Color_*,_std::allocator<CAMFImporter_NodeElement_Color_*>_>
    ::~vector((vector<CAMFImporter_NodeElement_Color_*,_std::allocator<CAMFImporter_NodeElement_Color_*>_>
               *)local_90);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~vector
              ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
               &color_arr.
                super__Vector_base<CAMFImporter_NodeElement_Color_*,_std::allocator<CAMFImporter_NodeElement_Color_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::_List_const_iterator<CAMFImporter_NodeElement_*>::operator++(&__end1);
  }
  return;
}

Assistant:

void AMFImporter::Postprocess_BuildNodeAndObject(const CAMFImporter_NodeElement_Object& pNodeElement, std::list<aiMesh*>& pMeshList, aiNode** pSceneNode)
{
CAMFImporter_NodeElement_Color* object_color = nullptr;

	// create new aiNode and set name as <object> has.
	*pSceneNode = new aiNode;
	(*pSceneNode)->mName = pNodeElement.ID;
	// read mesh and color
	for(const CAMFImporter_NodeElement* ne_child: pNodeElement.Child)
	{
		std::vector<aiVector3D> vertex_arr;
		std::vector<CAMFImporter_NodeElement_Color*> color_arr;

		// color for object
		if(ne_child->Type == CAMFImporter_NodeElement::ENET_Color) object_color = (CAMFImporter_NodeElement_Color*)ne_child;

		if(ne_child->Type == CAMFImporter_NodeElement::ENET_Mesh)
		{
			// Create arrays from children of mesh: vertices.
			PostprocessHelper_CreateMeshDataArray(*((CAMFImporter_NodeElement_Mesh*)ne_child), vertex_arr, color_arr);
			// Use this arrays as a source when creating every aiMesh
			Postprocess_BuildMeshSet(*((CAMFImporter_NodeElement_Mesh*)ne_child), vertex_arr, color_arr, object_color, pMeshList, **pSceneNode);
		}
	}// for(const CAMFImporter_NodeElement* ne_child: pNodeElement)
}